

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void warn_equality_value(lyxp_expr *exp,lyxp_set *set,uint32_t val_exp,uint32_t equal_exp,
                        uint32_t last_equal_exp)

{
  lysc_node *plVar1;
  lys_module *plVar2;
  ly_ctx *plVar3;
  undefined8 uVar4;
  lysc_node *plVar5;
  char *pcVar6;
  size_t sVar7;
  void *local_88;
  ly_err_item *err;
  undefined1 local_78 [4];
  LY_ERR rc;
  lyd_value storage;
  char *value;
  lysc_type *type;
  lysc_node *scnode;
  uint32_t last_equal_exp_local;
  uint32_t equal_exp_local;
  uint32_t val_exp_local;
  lyxp_set *set_local;
  lyxp_expr *exp_local;
  
  local_88 = (void *)0x0;
  plVar5 = warn_get_scnode_in_ctx(set);
  if (((plVar5 != (lysc_node *)0x0) && ((plVar5->nodetype & 0xc) != 0)) &&
     ((exp->tokens[val_exp] == LYXP_TOKEN_LITERAL || (exp->tokens[val_exp] == LYXP_TOKEN_NUMBER))))
  {
    if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
      storage.field_2._16_8_ =
           strndup(exp->expr + (ulong)exp->tok_pos[val_exp] + 1,(ulong)(exp->tok_len[val_exp] - 2));
    }
    else {
      storage.field_2._16_8_ =
           strndup(exp->expr + exp->tok_pos[val_exp],(ulong)exp->tok_len[val_exp]);
    }
    if (storage.field_2._16_8_ == 0) {
      ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","warn_equality_value");
    }
    else {
      if ((*(int *)&(plVar5[1].parent)->next == 0xc) &&
         (pcVar6 = strchr((char *)storage.field_2._16_8_,0x3a), pcVar6 == (char *)0x0)) {
        ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
               "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding a prefix or best using \"derived-from(-or-self)()\" functions."
               ,plVar5->name,storage.field_2._16_8_);
        warn_subexpr_log(set->ctx,exp->tok_pos[equal_exp],exp->expr + exp->tok_pos[equal_exp],
                         (exp->tok_pos[last_equal_exp] - exp->tok_pos[equal_exp]) +
                         exp->tok_len[last_equal_exp],(set->field_10).cur_scnode);
      }
      uVar4 = storage.field_2._16_8_;
      plVar1 = plVar5[1].parent;
      if (*(int *)&plVar1->next != 0xc) {
        plVar2 = plVar1->parent->module;
        plVar3 = set->ctx;
        sVar7 = strlen((char *)storage.field_2._16_8_);
        err._4_4_ = (*(code *)plVar2)(plVar3,plVar1,uVar4,sVar7,0,set->format,set->prefix_data,0x3f3
                                      ,plVar5,local_78,0,&local_88);
        if (err._4_4_ == 9) {
          err._4_4_ = 0;
        }
        if (local_88 == (void *)0x0) {
          if (err._4_4_ != 0) {
            ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,"Invalid value \"%s\" which does not fit the type.",
                   storage.field_2._16_8_);
          }
        }
        else {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Invalid value \"%s\" which does not fit the type (%s).",storage.field_2._16_8_,
                 *(undefined8 *)((long)local_88 + 0x10));
          ly_err_free(local_88);
        }
        if (err._4_4_ == 0) {
          (*(code *)plVar1->parent->ref)(set->ctx,local_78);
        }
        else {
          warn_subexpr_log(set->ctx,exp->tok_pos[equal_exp],exp->expr + exp->tok_pos[equal_exp],
                           (exp->tok_pos[last_equal_exp] - exp->tok_pos[equal_exp]) +
                           exp->tok_len[last_equal_exp],(set->field_10).cur_scnode);
        }
      }
      free((void *)storage.field_2._16_8_);
    }
  }
  return;
}

Assistant:

static void
warn_equality_value(const struct lyxp_expr *exp, struct lyxp_set *set, uint32_t val_exp, uint32_t equal_exp,
        uint32_t last_equal_exp)
{
    struct lysc_node *scnode;
    struct lysc_type *type;
    char *value;
    struct lyd_value storage;
    LY_ERR rc;
    struct ly_err_item *err = NULL;

    if ((scnode = warn_get_scnode_in_ctx(set)) && (scnode->nodetype & (LYS_LEAF | LYS_LEAFLIST)) &&
            ((exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) || (exp->tokens[val_exp] == LYXP_TOKEN_NUMBER))) {
        /* check that the node can have the specified value */
        if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
            value = strndup(exp->expr + exp->tok_pos[val_exp] + 1, exp->tok_len[val_exp] - 2);
        } else {
            value = strndup(exp->expr + exp->tok_pos[val_exp], exp->tok_len[val_exp]);
        }
        if (!value) {
            LOGMEM(set->ctx);
            return;
        }

        if ((((struct lysc_node_leaf *)scnode)->type->basetype == LY_TYPE_IDENT) && !strchr(value, ':')) {
            LOGWRN(set->ctx, "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding"
                    " a prefix or best using \"derived-from(-or-self)()\" functions.", scnode->name, value);
            warn_subexpr_log(set->ctx, exp->tok_pos[equal_exp], exp->expr + exp->tok_pos[equal_exp],
                    (exp->tok_pos[last_equal_exp] - exp->tok_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                    set->cur_scnode);
        }

        type = ((struct lysc_node_leaf *)scnode)->type;
        if (type->basetype != LY_TYPE_IDENT) {
            rc = type->plugin->store(set->ctx, type, value, strlen(value), 0, set->format, set->prefix_data,
                    LYD_HINT_DATA, scnode, &storage, NULL, &err);
            if (rc == LY_EINCOMPLETE) {
                rc = LY_SUCCESS;
            }

            if (err) {
                LOGWRN(set->ctx, "Invalid value \"%s\" which does not fit the type (%s).", value, err->msg);
                ly_err_free(err);
            } else if (rc != LY_SUCCESS) {
                LOGWRN(set->ctx, "Invalid value \"%s\" which does not fit the type.", value);
            }
            if (rc != LY_SUCCESS) {
                warn_subexpr_log(set->ctx, exp->tok_pos[equal_exp], exp->expr + exp->tok_pos[equal_exp],
                        (exp->tok_pos[last_equal_exp] - exp->tok_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                        set->cur_scnode);
            } else {
                type->plugin->free(set->ctx, &storage);
            }
        }
        free(value);
    }
}